

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrun.cpp
# Opt level: O0

int __thiscall vm_rcdesc::init(vm_rcdesc *this,EVP_PKEY_CTX *ctx)

{
  uchar *puVar1;
  unsigned_short in_CX;
  vm_obj_id_t in_EDX;
  vm_val_t *in_R8;
  int in_R9D;
  
  this->name = (char *)ctx;
  vm_val_t::set_nil(&this->bifptr);
  vm_val_t::set_obj(&this->self,in_EDX);
  this->method_idx = in_CX;
  this->argp = in_R8;
  this->argc = in_R9D;
  puVar1 = CVmRun::get_last_pc();
  this->caller_addr = puVar1;
  return (int)this;
}

Assistant:

void vm_rcdesc::init(VMG_ const char *name,
                     vm_obj_id_t self, unsigned short method_idx,
                     vm_val_t *argp, int argc)
{
    this->name = name;
    this->bifptr.set_nil();
    this->self.set_obj(self);
    this->method_idx = method_idx;
    this->argp = argp;
    this->argc = argc;
    this->caller_addr = G_interpreter->get_last_pc();
}